

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

void outputErrorLine(EOutputVerbosity errorLevel,int keywordPos,int keywordSz)

{
  bool bVar1;
  size_t sVar2;
  FILE *__stream;
  FILE *lstFile;
  int keywordSz_local;
  int keywordPos_local;
  EOutputVerbosity errorLevel_local;
  
  bVar1 = false;
  if ((-1 < keywordPos) && (bVar1 = false, 0 < keywordSz)) {
    sVar2 = strlen(ErrorLine);
    bVar1 = keywordPos + keywordSz <= (int)sVar2;
  }
  if (bVar1) {
    __stream = (FILE *)GetListingFile();
    if ((__stream != (FILE *)0x0) || (Options::OutputVerbosity <= (int)errorLevel)) {
      trimAndAddEol(ErrorLine);
      trimAndAddEol(ErrorLine2);
      if ((__stream != (FILE *)0x0) && (fputs(ErrorLine,__stream), ErrorLine2[0] != '\0')) {
        fputs(ErrorLine2,__stream);
      }
      if (Options::OutputVerbosity <= (int)errorLevel) {
        if (keywordPos != 0) {
          std::ostream::write((char *)&std::cerr,0x1dd9b0);
        }
        if (errorLevel == OV_ERROR) {
          std::operator<<((ostream *)&std::cerr,*(char **)(Options::tcols + 0x18));
        }
        if (errorLevel == OV_WARNING) {
          std::operator<<((ostream *)&std::cerr,*(char **)(Options::tcols + 0x10));
        }
        std::ostream::write((char *)&std::cerr,(long)(ErrorLine + keywordPos));
        std::operator<<((ostream *)&std::cerr,*(char **)Options::tcols);
        std::operator<<((ostream *)&std::cerr,ErrorLine + (long)keywordSz + (long)keywordPos);
        if (ErrorLine2[0] != '\0') {
          std::operator<<((ostream *)&std::cerr,ErrorLine2);
        }
      }
    }
    return;
  }
  __assert_fail("0 <= keywordPos && 1 <= keywordSz && keywordPos + keywordSz <= int(strlen(ErrorLine))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/io_err.cpp"
                ,0x44,"void outputErrorLine(const EOutputVerbosity, int, int)");
}

Assistant:

static void outputErrorLine(const EOutputVerbosity errorLevel, int keywordPos, int keywordSz) {
	assert(0 <= keywordPos && 1 <= keywordSz && keywordPos + keywordSz <= int(strlen(ErrorLine)));	// keyword is mandatory
	auto lstFile = GetListingFile();
	if (!lstFile && errorLevel < Options::OutputVerbosity) return;	// no output required
	// trim end of error/warning line and add EOL char if needed
	trimAndAddEol(ErrorLine);
	trimAndAddEol(ErrorLine2);
	// always print the message into listing file (the OutputVerbosity does not apply to listing)
	if (lstFile) {
		fputs(ErrorLine, lstFile);
		if (*ErrorLine2) fputs(ErrorLine2, lstFile);
	}
	// print the error into stderr if OutputVerbosity allows this type of message
	if (Options::OutputVerbosity <= errorLevel) {
		if (keywordPos) cerr.write(ErrorLine, keywordPos);	// output filename and line position
		// colorize the keyword in message
		if (OV_ERROR == errorLevel) _CERR Options::tcols->error _END;
		if (OV_WARNING == errorLevel) _CERR Options::tcols->warning _END;
		cerr.write(ErrorLine + keywordPos, keywordSz);
		// switch color off for rest of message
		_CERR Options::tcols->end _END;
		_CERR ErrorLine + keywordPos + keywordSz _END;
		if (*ErrorLine2) _CERR ErrorLine2 _END;
	}
}